

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

ConnectionSyntax __thiscall
CPP::WriteInitialization::connectionSyntax
          (WriteInitialization *this,SignalSlot *sender,SignalSlot *receiver)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ConnectionSyntax CVar4;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  initializer_list<QString> args;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(uint *)this->m_option >> 9 & 1) != 0) {
    CVar4 = MemberFunctionPtr;
    goto LAB_0012dc54;
  }
  if ((*(uint *)this->m_option >> 10 & 1) == 0) {
    if (connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)::
        requiresStringSyntax == '\0') {
      iVar3 = __cxa_guard_acquire(&connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)
                                   ::requiresStringSyntax);
      if (iVar3 != 0) {
        local_50.d = (Data *)0x0;
        local_68.d = (Data *)0x0;
        local_68.ptr = (char16_t *)0x0;
        local_50.ptr = L"QAxWidget";
        local_68.size = 0;
        local_50.size = 9;
        args._M_len = 1;
        args._M_array = (iterator)&local_50;
        QList<QString>::QList(&connectionSyntax::requiresStringSyntax,args);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        __cxa_atexit(QList<QString>::~QList,&connectionSyntax::requiresStringSyntax,&__dso_handle);
        __cxa_guard_release(&connectionSyntax(language::SignalSlot_const&,language::SignalSlot_const&)
                             ::requiresStringSyntax);
      }
    }
    bVar1 = QListSpecialMethods<QString>::contains
                      ((QListSpecialMethods<QString> *)&connectionSyntax::requiresStringSyntax,
                       &sender->className,CaseSensitive);
    if (!bVar1) {
      CVar4 = MemberFunctionPtr;
      bVar1 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&connectionSyntax::requiresStringSyntax,
                         &receiver->className,CaseSensitive);
      if (!bVar1) {
        bVar1 = comparesEqual(&sender->name,&this->m_mainFormVarName);
        if (bVar1) {
          bVar1 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)&this->m_customSignals,
                             &sender->signature,CaseSensitive);
          if (bVar1) goto LAB_0012dc4d;
        }
        bVar1 = comparesEqual(&receiver->name,&this->m_mainFormVarName);
        if (bVar1) {
          bVar1 = QListSpecialMethods<QString>::contains
                            ((QListSpecialMethods<QString> *)&this->m_customSlots,
                             &receiver->signature,CaseSensitive);
          if (bVar1) goto LAB_0012dc4d;
        }
        QVar5.m_data = (char *)0x2;
        QVar5.m_size = (qsizetype)&sender->signature;
        cVar2 = QString::endsWith(QVar5,0x16f5e5);
        if (cVar2 == '\0') {
          bVar1 = isCustomWidget(this,&sender->className);
          CVar4 = StringBased;
          if (!bVar1) {
            bVar1 = isCustomWidget(this,&receiver->className);
            CVar4 = (ConnectionSyntax)!bVar1;
          }
        }
        goto LAB_0012dc54;
      }
    }
  }
LAB_0012dc4d:
  CVar4 = StringBased;
LAB_0012dc54:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return CVar4;
  }
  __stack_chk_fail();
}

Assistant:

ConnectionSyntax WriteInitialization::connectionSyntax(const language::SignalSlot &sender,
                                                       const language::SignalSlot &receiver) const
{
    if (m_option.forceMemberFnPtrConnectionSyntax)
        return ConnectionSyntax::MemberFunctionPtr;
    if (m_option.forceStringConnectionSyntax)
        return ConnectionSyntax::StringBased;
    // Auto mode: Use Qt 5 connection syntax for Qt classes and parameterless
    // connections. QAxWidget is special though since it has a fake Meta object.
    static const QStringList requiresStringSyntax{QStringLiteral("QAxWidget")};
    if (requiresStringSyntax.contains(sender.className)
        || requiresStringSyntax.contains(receiver.className)) {
        return ConnectionSyntax::StringBased;
    }

    if ((sender.name == m_mainFormVarName && m_customSignals.contains(sender.signature))
         || (receiver.name == m_mainFormVarName && m_customSlots.contains(receiver.signature))) {
        return ConnectionSyntax::StringBased;
    }

    return sender.signature.endsWith("()"_L1)
        || (!isCustomWidget(sender.className) && !isCustomWidget(receiver.className))
        ? ConnectionSyntax::MemberFunctionPtr : ConnectionSyntax::StringBased;
}